

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Off_reader.h
# Opt level: O1

bool __thiscall Gudhi::Off_reader::goto_next_uncomment_line(Off_reader *this,string *uncomment_line)

{
  istream *piVar1;
  char cVar2;
  sentry local_29;
  
  do {
    std::istream::sentry::sentry(&local_29,(istream *)this->stream_,false);
    if (local_29 != (sentry)0x1) {
      return false;
    }
    piVar1 = (istream *)this->stream_;
    cVar2 = std::ios::widen((char)*(undefined8 *)(*(long *)piVar1 + -0x18) + (char)piVar1);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              (piVar1,(string *)uncomment_line,cVar2);
  } while (*(uncomment_line->_M_dataplus)._M_p == '#');
  return ((byte)this->stream_[*(long *)(*(long *)this->stream_ + -0x18) + 0x20] & 5) == 0;
}

Assistant:

bool goto_next_uncomment_line(std::string& uncomment_line) {
    do {
      // skip whitespace, including empty lines
      if (!std::ifstream::sentry(stream_)) return false;
      std::getline(stream_, uncomment_line);
    } while (uncomment_line[0] == '#');
    return static_cast<bool>(stream_);
  }